

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O1

Gia_Man_t *
Gia_GenQbfMiter(Gia_Man_t *p,int nFrames,int nLutNum,int nLutSize,char *pStr,int fUseOut,
               int fVerbose)

{
  char *pcVar1;
  ulong uVar2;
  uint *__ptr;
  byte bVar3;
  uint uVar4;
  Vec_Int_t *vFlops;
  Vec_Int_t *p_00;
  int *piVar5;
  Gia_Man_t *p_01;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  Vec_Int_t *__ptr_00;
  Gia_Man_t *pGVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int Entry;
  long lVar17;
  Gia_Obj_t *pGVar18;
  int iVar19;
  
  bVar3 = (byte)nLutSize & 0x1f;
  iVar15 = nLutNum << bVar3;
  vFlops = Gia_GenCollectFlopIndexes(pStr,nLutNum,nLutSize,p->nRegs);
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < iVar15 - 1U) {
    iVar14 = iVar15;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar14;
  if (iVar14 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar14 << 2);
  }
  p_00->pArray = piVar5;
  if (0 < nLutNum << bVar3) {
    iVar14 = 0;
    iVar19 = 2;
    do {
      Entry = iVar19;
      if (iVar14 == 0) {
        Entry = 1;
      }
      Vec_IntPush(p_00,Entry);
      iVar14 = iVar14 + 1;
      iVar19 = iVar19 + 2;
    } while (iVar15 != iVar14);
  }
  p_01 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_01->pName = pcVar7;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_01->pSpec = pcVar7;
  Gia_ManHashAlloc(p_01);
  p->pObjs->Value = 0;
  if (0 < nLutNum << bVar3) {
    do {
      pGVar8 = Gia_ManAppendObj(p_01);
      uVar2 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar2 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar2 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar18 = p_01->pObjs;
      if ((pGVar8 < pGVar18) || (pGVar18 + p_01->nObjs <= pGVar8)) goto LAB_00793efb;
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar18) >> 2) * -0x55555555);
      if ((pGVar8 < p_01->pObjs) || (p_01->pObjs + p_01->nObjs <= pGVar8)) goto LAB_00793efb;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
  }
  pVVar10 = p->vCis;
  if (0 < pVVar10->nSize) {
    lVar16 = 0;
    do {
      iVar14 = pVVar10->pArray[lVar16];
      if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_00793f1a;
      pGVar18 = p->pObjs;
      if (pGVar18 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p_01);
      uVar2 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar2 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar2 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar8 = p_01->pObjs;
      if ((pGVar9 < pGVar8) || (pGVar8 + p_01->nObjs <= pGVar9)) {
LAB_00793efb:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * -0x55555555);
      pGVar8 = p_01->pObjs;
      if ((pGVar9 < pGVar8) || (pGVar8 + p_01->nObjs <= pGVar9)) goto LAB_00793efb;
      pGVar18[iVar14].Value = (int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * 0x55555556;
      lVar16 = lVar16 + 1;
      pVVar10 = p->vCis;
    } while (lVar16 < pVVar10->nSize);
  }
  iVar14 = p->nObjs;
  if ((0 < iVar14) && (pGVar18 = p->pObjs, pGVar18 != (Gia_Obj_t *)0x0)) {
    lVar16 = 0;
    do {
      uVar2 = *(ulong *)pGVar18;
      if ((uVar2 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar2) {
        if ((int)pGVar18[-(uVar2 & 0x1fffffff)].Value < 0) goto LAB_00793f39;
        uVar4 = (uint)(uVar2 >> 0x20);
        if ((int)pGVar18[-(ulong)(uVar4 & 0x1fffffff)].Value < 0) goto LAB_00793f39;
        uVar4 = Gia_ManHashAnd(p_01,pGVar18[-(uVar2 & 0x1fffffff)].Value ^ (uint)(uVar2 >> 0x1d) & 1
                               ,pGVar18[-(ulong)(uVar4 & 0x1fffffff)].Value ^ uVar4 >> 0x1d & 1);
        pGVar18->Value = uVar4;
      }
      lVar16 = lVar16 + 1;
      iVar14 = p->nObjs;
    } while ((lVar16 < iVar14) && (pGVar18 = p->pObjs + lVar16, p->pObjs != (Gia_Obj_t *)0x0));
  }
  lVar16 = (long)p->vCos->nSize;
  if (0 < lVar16) {
    piVar5 = p->vCos->pArray;
    lVar17 = 0;
    do {
      iVar15 = piVar5[lVar17];
      if (((long)iVar15 < 0) || (iVar14 <= iVar15)) goto LAB_00793f1a;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar18 = p->pObjs + iVar15;
      if ((int)pGVar18[-(ulong)((uint)*(undefined8 *)pGVar18 & 0x1fffffff)].Value < 0)
      goto LAB_00793f39;
      pGVar18->Value =
           (uint)*(undefined8 *)pGVar18 >> 0x1d & 1 ^
           pGVar18[-(ulong)((uint)*(undefined8 *)pGVar18 & 0x1fffffff)].Value;
      lVar17 = lVar17 + 1;
    } while (lVar16 != lVar17);
  }
  pVVar10 = Gia_GenCreateMuxes(p,p_01,vFlops,nLutNum,nLutSize,p_00,0);
  __ptr_00 = Gia_GenCreateMuxes(p,p_01,vFlops,nLutNum,nLutSize,p_00,1);
  if ((0 < pVVar10->nSize) && (0 < __ptr_00->nSize)) {
    piVar5 = pVVar10->pArray;
    iVar14 = *piVar5;
    __ptr = (uint *)__ptr_00->pArray;
    uVar4 = *__ptr;
    if (fUseOut != 0) {
      iVar15 = p->vCos->nSize;
      uVar12 = ~p->nRegs + iVar15;
      if (((int)uVar12 < 0) || (iVar15 <= (int)uVar12)) goto LAB_00793f58;
      iVar15 = p->vCos->pArray[uVar12];
      if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) {
LAB_00793f1a:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar13 = (uint)*(undefined8 *)(p->pObjs + iVar15);
      uVar12 = (p->pObjs + iVar15)[-(ulong)(uVar13 & 0x1fffffff)].Value;
      if ((int)uVar12 < 0) {
LAB_00793f39:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar4 = Gia_ManHashAnd(p_01,uVar4,uVar12 ^ uVar13 >> 0x1d & 1 ^ 1);
    }
    if ((-1 < (int)uVar4) && (uVar4 = Gia_ManHashAnd(p_01,iVar14,uVar4 ^ 1), -1 < (int)uVar4)) {
      iVar14 = Gia_ManHashAnd(p_01,uVar4 ^ 1,2);
      Gia_ManAppendCo(p_01,iVar14);
      free(piVar5);
      pVVar10->pArray = (int *)0x0;
      if (pVVar10 != (Vec_Int_t *)0x0) {
        free(pVVar10);
      }
      free(__ptr);
      __ptr_00->pArray = (int *)0x0;
      if (__ptr_00 != (Vec_Int_t *)0x0) {
        free(__ptr_00);
      }
      if (vFlops->pArray != (int *)0x0) {
        free(vFlops->pArray);
        vFlops->pArray = (int *)0x0;
      }
      if (vFlops != (Vec_Int_t *)0x0) {
        free(vFlops);
      }
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
        p_00->pArray = (int *)0x0;
      }
      free(p_00);
      pGVar11 = Gia_ManCleanup(p_01);
      Gia_ManStop(p_01);
      return pGVar11;
    }
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x131,"int Abc_LitNot(int)");
  }
LAB_00793f58:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Gia_Man_t * Gia_GenQbfMiter( Gia_Man_t * p, int nFrames, int nLutNum, int nLutSize, char * pStr, int fUseOut, int fVerbose )
{
    Gia_Obj_t * pObj; 
    Gia_Man_t * pTemp, * pNew;
    int i, iMiter, iLut0, iLut1, nPars = nLutNum * (1 << nLutSize);
    Vec_Int_t * vLits0, * vLits1, * vParLits;
    Vec_Int_t * vFlops = Gia_GenCollectFlopIndexes( pStr, nLutNum, nLutSize, Gia_ManRegNum(p) );
    // collect parameter literals (data vars)
    vParLits = Vec_IntAlloc( nPars );
    for ( i = 0; i < nPars; i++ )
        Vec_IntPush( vParLits, i ? Abc_Var2Lit(i+1, 0) : 1 );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    for ( i = 0; i < nPars; i++ )
        Gia_ManAppendCi( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    vLits0 = Gia_GenCreateMuxes( p, pNew, vFlops, nLutNum, nLutSize, vParLits, 0 );
    vLits1 = Gia_GenCreateMuxes( p, pNew, vFlops, nLutNum, nLutSize, vParLits, 1 );
    // create miter output
    //iMiter = Gia_ManHashAnd( pNew, Vec_IntEntry(vLits0, 0), Abc_LitNot(Vec_IntEntry(vLits1, 0)) );
    ///////////////////////////////////////////////////////////////////////////
    iLut0 = Vec_IntEntry(vLits0, 0);
    iLut1 = Vec_IntEntry(vLits1, 0);
    if ( fUseOut )
    {
        Gia_Obj_t * pObjPoLast = Gia_ManPo( p, Gia_ManPoNum(p)-1 );
        int iOut = Abc_LitNotCond( Gia_ObjFanin0Copy(pObjPoLast), 0 );
        iLut1 = Gia_ManHashAnd( pNew, iLut1, Abc_LitNot(iOut) );
    }
    iMiter = Gia_ManHashAnd( pNew, iLut0, Abc_LitNot(iLut1) );
    ///////////////////////////////////////////////////////////////////////////
    iMiter = Gia_ManHashAnd( pNew, Abc_LitNot(iMiter), Abc_Var2Lit(1, 0) );
    Gia_ManAppendCo( pNew, iMiter );
    // cleanup
    Vec_IntFree( vLits0 );
    Vec_IntFree( vLits1 );
    Vec_IntFree( vFlops );
    Vec_IntFree( vParLits );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}